

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  FunctionBody *functionBody;
  bool bVar2;
  PropertyId PVar3;
  Var pvVar4;
  Var pvVar5;
  InlineCache *pIVar6;
  RecyclableObject *object;
  RecyclableObject *instance;
  unsigned_short localRegisterID;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  pvVar4 = GetReg<unsigned_short>(this,playout->Instance);
  pvVar5 = GetReg<unsigned_short>(this,playout->Value2);
  pIVar6 = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  PVar3 = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  bVar2 = VarIs<Js::RecyclableObject>(pvVar4);
  if (bVar2) {
    bVar2 = VarIs<Js::RecyclableObject>(pvVar5);
    if (bVar2) {
      object = VarTo<Js::RecyclableObject>(pvVar4);
      instance = VarTo<Js::RecyclableObject>(pvVar5);
      local_90 = (undefined1  [8])0x0;
      info.m_instance = (RecyclableObject *)0x50000ffff;
      info.m_propertyIndex = 0;
      info.m_attributes = '\0';
      info.flags = InlineCacheNoFlags;
      info.cacheInfoFlag = 0;
      info.inlineCache = (InlineCache *)0x0;
      info.prop = (RecyclableObject *)0x0;
      info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      info.functionBody = (FunctionBody *)0x0;
      info.propertyRecordUsageCache._0_4_ = 0xffffffff;
      info.propertyRecordUsageCache._5_1_ = 1;
      PropertyValueInfo::SetCacheInfo
                ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),pIVar6,
                 (uint)playout->PropertyIdIndex,true);
      bVar2 = CacheOperators::
              TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                        (instance,false,object,PVar3,(Var *)&info.inlineCacheIndex,
                         *(ScriptContext **)(this + 0x78),(PropertyCacheOperationInfo *)0x0,
                         (PropertyValueInfo *)local_90);
      if (bVar2) {
        localRegisterID = playout->Value;
        goto LAB_0095ce5c;
      }
    }
  }
  localRegisterID = playout->Value;
  functionBody = *(FunctionBody **)(this + 0x88);
  pIVar6 = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  uVar1 = playout->PropertyIdIndex;
  pvVar4 = GetReg<unsigned_short>(this,playout->Instance);
  PVar3 = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  pvVar5 = GetReg<unsigned_short>(this,playout->Value2);
  info._56_8_ = JavascriptOperators::PatchGetValueWithThisPtr<false,Js::InlineCache>
                          (functionBody,pIVar6,(uint)uVar1,pvVar4,PVar3,pvVar5);
LAB_0095ce5c:
  SetReg<unsigned_short>(this,localRegisterID,(Var)info._56_8_);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetSuperProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Var instance = GetReg(playout->Instance);
        Var thisInstance = GetReg(playout->Value2);
        InlineCache *inlineCache = GetInlineCache(playout->PropertyIdIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->PropertyIdIndex);
        if (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance))
        {
            RecyclableObject* superObj = VarTo<RecyclableObject>(instance);
            RecyclableObject* thisObj = VarTo<RecyclableObject>(thisInstance);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->PropertyIdIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                thisObj, false, superObj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetValueWithThisPtr<false>(
                GetFunctionBody(),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetReg(playout->Value2)));
    }